

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

ImPlotPoint __thiscall
ImPlot::GetterXsYs<unsigned_short>::operator()(GetterXsYs<unsigned_short> *this,int idx)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  int idx_local;
  GetterXsYs<unsigned_short> *this_local;
  
  uVar1 = OffsetAndStride<unsigned_short>(this->Xs,idx,this->Count,this->Offset,this->Stride);
  uVar2 = OffsetAndStride<unsigned_short>(this->Ys,idx,this->Count,this->Offset,this->Stride);
  ImPlotPoint::ImPlotPoint((ImPlotPoint *)&this_local,(double)uVar1,(double)uVar2);
  return _this_local;
}

Assistant:

inline ImPlotPoint operator()(int idx) const {
        return ImPlotPoint((double)OffsetAndStride(Xs, idx, Count, Offset, Stride), (double)OffsetAndStride(Ys, idx, Count, Offset, Stride));
    }